

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O0

bool dxil_spv::emit_wave_ballot_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  Id IVar2;
  Builder *this;
  Value *value;
  Operation *this_00;
  Operation *op;
  Id bool_value;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  op._4_4_ = Converter::Impl::get_id_for_value(impl,value,0);
  bVar1 = wave_op_needs_helper_lane_masking(impl);
  if (bVar1) {
    op._4_4_ = build_masked_ballot(impl,op._4_4_);
  }
  IVar2 = spv::Builder::makeUintType(this,0x20);
  IVar2 = spv::Builder::makeVectorType(this,IVar2,4);
  this_00 = Converter::Impl::allocate(impl,OpGroupNonUniformBallot,(Value *)instruction,IVar2);
  IVar2 = spv::Builder::makeUintConstant(this,3,false);
  Operation::add_id(this_00,IVar2);
  Operation::add_id(this_00,op._4_4_);
  Converter::Impl::add(impl,this_00,false);
  spv::Builder::addCapability(this,CapabilityGroupNonUniformBallot);
  return true;
}

Assistant:

bool emit_wave_ballot_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	spv::Id bool_value;

	bool_value = impl.get_id_for_value(instruction->getOperand(1));
	if (wave_op_needs_helper_lane_masking(impl))
		bool_value = build_masked_ballot(impl, bool_value);

	auto *op = impl.allocate(spv::OpGroupNonUniformBallot, instruction,
	                         builder.makeVectorType(builder.makeUintType(32), 4));
	op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
	op->add_id(bool_value);

	impl.add(op);
	builder.addCapability(spv::CapabilityGroupNonUniformBallot);
	return true;
}